

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  alpha_cluster *paVar8;
  uint *puVar9;
  byte *pbVar10;
  unsigned_long_long *puVar11;
  float fVar12;
  bool local_6e5;
  uint local_6bc;
  uint local_6ac;
  int local_678;
  uint local_62c;
  undefined1 local_628 [4];
  uint i_4;
  results refinerResults;
  params refinerParams;
  uint error;
  int delta_1;
  uint8 s;
  uint8 t;
  uint uStack_5cc;
  uint8 s_best;
  uint error_best;
  uint p;
  uint64 selector;
  uint weight;
  uint b;
  uint i_3;
  vector<unsigned_int> *blocks;
  uint local_5a0;
  uint component_index;
  uint a;
  int i_2;
  int *modifier;
  int multiplier;
  int modifier_index;
  int base_codeword;
  uint i_1;
  uint endpoint_weight;
  uint encoding_weight [8];
  uint local_54c;
  int delta;
  uint i;
  uint alpha_values [8];
  uint block_values [8];
  undefined1 local_500 [8];
  results results;
  params params;
  alpha_cluster *cluster;
  undefined1 local_4b8 [4];
  uint cluster_index;
  vector<unsigned_char> selectors;
  undefined1 local_498 [8];
  dxt_endpoint_refiner refiner;
  dxt5_endpoint_optimizer optimizer;
  uint num_tasks;
  void *param_3_local;
  uint64 data_local;
  dxt_hc *this_local;
  
  uVar3 = task_pool::get_num_threads(this->m_pTask_pool);
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer((dxt5_endpoint_optimizer *)&refiner.m_pResults);
  dxt_endpoint_refiner::dxt_endpoint_refiner((dxt_endpoint_refiner *)local_498);
  vector<unsigned_char>::vector((vector<unsigned_char> *)local_4b8);
  for (cluster._4_4_ = (uint)data;
      uVar4 = vector<crnlib::dxt_hc::alpha_cluster>::size(&this->m_alpha_clusters),
      cluster._4_4_ < uVar4; cluster._4_4_ = uVar3 + 1 + cluster._4_4_) {
    paVar8 = vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                       (&this->m_alpha_clusters,cluster._4_4_);
    bVar2 = vector<crnlib::color_quad<unsigned_char,_int>_>::empty(&paVar8->pixels);
    if (!bVar2) {
      dxt5_endpoint_optimizer::params::params((params *)&results.m_first_endpoint);
      vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&paVar8->pixels);
      uVar4 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&paVar8->pixels);
      vector<unsigned_char>::resize((vector<unsigned_char> *)local_4b8,uVar4,false);
      local_500 = (undefined1  [8])
                  vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_4b8);
      dxt5_endpoint_optimizer::compute
                ((dxt5_endpoint_optimizer *)&refiner.m_pResults,(params *)&results.m_first_endpoint,
                 (results *)local_500);
      paVar8->first_endpoint = (uint)(byte)results.m_error;
      paVar8->second_endpoint = (uint)results.m_error._1_1_;
      dxt5_block::get_block_values(alpha_values + 6,paVar8->first_endpoint,paVar8->second_endpoint);
      for (local_54c = 0; local_54c < 8; local_54c = local_54c + 1) {
        uVar4 = alpha_values[(ulong)*(byte *)((long)&g_dxt5_from_linear + (ulong)local_54c) + 6];
        paVar8->alpha_values[local_54c] = uVar4;
        (&delta)[local_54c] = uVar4;
      }
      iVar5 = paVar8->first_endpoint - paVar8->second_endpoint;
      uVar6 = math::clamp<unsigned_int>((uint)(iVar5 * iVar5) >> 3,1,0x800);
      for (modifier_index = 0; (uint)modifier_index < 8; modifier_index = modifier_index + 1) {
        fVar12 = math::lerp<float,float>(1.15,1.0,(float)(uint)modifier_index * 0.14285715);
        (&i_1)[(uint)modifier_index] = (uint)(long)((float)uVar6 * fVar12);
      }
      if ((this->m_has_etc_color_blocks & 1U) != 0) {
        uVar4 = (int)((uint)(byte)results.m_error + (uint)results.m_error._1_1_ + 1) >> 1;
        uVar6 = 0xb;
        if (iVar5 < 7) {
          uVar6 = 0xd;
          local_678 = 1;
        }
        else {
          local_678 = math::clamp<int>((iVar5 + 0xc) / 0x12,1,0xf);
        }
        for (component_index = 0; (int)component_index < 8; component_index = component_index + 1) {
          uVar7 = math::clamp<int>(uVar4 + determine_alpha_endpoint_codebook_task::
                                           stripped_modifier_table[(int)(uint)(uVar6 != 0xb)]
                                           [(int)component_index] * local_678,0,0xff);
          paVar8->alpha_values[(int)component_index] = uVar7;
          (&delta)[(int)component_index] = uVar7;
        }
        paVar8->first_endpoint = uVar4;
        paVar8->second_endpoint = local_678 << 4 | uVar6;
      }
      for (local_5a0 = 0; local_5a0 < this->m_num_alpha_blocks; local_5a0 = local_5a0 + 1) {
        uVar4 = (this->m_params).m_alpha_component_indices[local_5a0];
        for (weight = 0; uVar7 = vector<unsigned_int>::size(paVar8->blocks + (local_5a0 + 1)),
            weight < uVar7; weight = weight + 1) {
          puVar9 = vector<unsigned_int>::operator[](paVar8->blocks + (local_5a0 + 1),weight);
          uVar7 = *puVar9;
          pbVar10 = vector<unsigned_char>::operator[](&this->m_block_encodings,uVar7);
          uVar6 = (&i_1)[*pbVar10];
          _error_best = 0;
          for (uStack_5cc = 0; uStack_5cc < 0x10; uStack_5cc = uStack_5cc + 1) {
            delta_1 = -1;
            error._3_1_ = 0;
            for (error._2_1_ = 0; error._2_1_ < 8; error._2_1_ = error._2_1_ + 1) {
              bVar1 = error._2_1_;
              if ((this->m_has_etc_color_blocks & 1U) == 0) {
                if ((results.m_error._3_1_ & 1) == 0) {
                  bVar1 = *(byte *)((long)&g_dxt5_to_linear + (ulong)error._2_1_);
                }
                else {
                  bVar1 = 7 - *(char *)((long)&g_dxt5_to_linear + (ulong)error._2_1_);
                }
              }
              local_6ac = uVar7;
              if ((this->m_has_subblocks & 1U) != 0) {
                local_6ac = uVar7 >> 1;
              }
              pbVar10 = color_quad<unsigned_char,_int>::operator[]
                                  (this->m_blocks[local_6ac] + uStack_5cc,uVar4);
              local_6bc = (uint)*pbVar10 - (&delta)[bVar1];
              if ((int)local_6bc < 0) {
                local_6bc = -local_6bc;
              }
              if (local_6bc < (uint)delta_1) {
                delta_1 = local_6bc;
                error._3_1_ = bVar1;
              }
            }
            _error_best = _error_best << 3 | (ulong)error._3_1_;
          }
          puVar11 = vector<unsigned_long_long>::operator[]
                              (this->m_block_selectors + (local_5a0 + 1),uVar7);
          *puVar11 = _error_best << 0x10 | (ulong)uVar6;
        }
      }
      dxt_endpoint_refiner::params::params((params *)&refinerResults.m_error);
      vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_4b8);
      vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&paVar8->pixels);
      vector<crnlib::color_quad<unsigned_char,_int>_>::size(&paVar8->pixels);
      refinerResults.m_error._0_4_ = cluster._4_4_;
      local_6e5 = false;
      if ((this->m_has_etc_color_blocks & 1U) == 0) {
        local_6e5 = dxt_endpoint_refiner::refine
                              ((dxt_endpoint_refiner *)local_498,(params *)&refinerResults.m_error,
                               (results *)local_628);
      }
      paVar8->refined_alpha = local_6e5;
      if ((paVar8->refined_alpha & 1U) == 0) {
        *(undefined8 *)paVar8->refined_alpha_values = *(undefined8 *)paVar8->alpha_values;
        *(undefined8 *)(paVar8->refined_alpha_values + 2) =
             *(undefined8 *)(paVar8->alpha_values + 2);
        *(undefined8 *)(paVar8->refined_alpha_values + 4) =
             *(undefined8 *)(paVar8->alpha_values + 4);
        *(undefined8 *)(paVar8->refined_alpha_values + 6) =
             *(undefined8 *)(paVar8->alpha_values + 6);
      }
      else {
        paVar8->first_endpoint = (uint)(ushort)local_628._0_2_;
        paVar8->second_endpoint = (uint)(ushort)local_628._2_2_;
        dxt5_block::get_block_values
                  (alpha_values + 6,paVar8->first_endpoint,paVar8->second_endpoint);
        for (local_62c = 0; local_62c < 8; local_62c = local_62c + 1) {
          paVar8->refined_alpha_values[local_62c] =
               alpha_values[(ulong)*(byte *)((long)&g_dxt5_from_linear + (ulong)local_62c) + 6];
        }
      }
    }
  }
  vector<unsigned_char>::~vector((vector<unsigned_char> *)local_4b8);
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer((dxt5_endpoint_optimizer *)&refiner.m_pResults);
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_codebook_task(uint64 data, void*) {
  const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  dxt5_endpoint_optimizer optimizer;
  dxt_endpoint_refiner refiner;
  crnlib::vector<uint8> selectors;

  for (uint cluster_index = (uint)data; cluster_index < m_alpha_clusters.size(); cluster_index += num_tasks) {
    alpha_cluster& cluster = m_alpha_clusters[cluster_index];
    if (cluster.pixels.empty())
      continue;

    dxt5_endpoint_optimizer::params params;
    params.m_pPixels = cluster.pixels.get_ptr();
    params.m_num_pixels = cluster.pixels.size();
    params.m_comp_index = 0;
    params.m_quality = cCRNDXTQualityUber;
    params.m_use_both_block_types = false;

    dxt5_endpoint_optimizer::results results;
    selectors.resize(params.m_num_pixels);
    results.m_pSelectors = selectors.get_ptr();

    optimizer.compute(params, results);
    cluster.first_endpoint = results.m_first_endpoint;
    cluster.second_endpoint = results.m_second_endpoint;
    uint block_values[8], alpha_values[8];
    dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
    for (uint i = 0; i < 8; i++)
      alpha_values[i] = cluster.alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    int delta = cluster.first_endpoint - cluster.second_endpoint;
    uint encoding_weight[8];
    for (uint endpoint_weight = math::clamp<uint>(delta * delta >> 3, 1, 2048), i = 0; i < 8; i++)
      encoding_weight[i] = (uint)(endpoint_weight * math::lerp(1.15f, 1.0f, i / 7.0f));

    if (m_has_etc_color_blocks) {
      static const int stripped_modifier_table[2][8] = {
        {-10, -7, -5, -2, 1, 4, 6, 9},
        {-10, -3, -2, -1, 0, 1, 2, 9}
      };
      int base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
      int modifier_index = delta <= 6 ? 13 : 11;
      int multiplier = delta <= 6 ? 1 : math::clamp<int>((delta + 12) / 18, 1, 15);
      const int* modifier = stripped_modifier_table[modifier_index == 11 ? 0 : 1];
      for (int i = 0; i < 8; i++)
        alpha_values[i] = cluster.alpha_values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
      cluster.first_endpoint = base_codeword;
      cluster.second_endpoint = multiplier << 4 | modifier_index;
    }

    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint component_index = m_params.m_alpha_component_indices[a];
      crnlib::vector<uint>& blocks = cluster.blocks[cAlpha0 + a];
      for (uint i = 0; i < blocks.size(); i++) {
        uint b = blocks[i];
        uint weight = encoding_weight[m_block_encodings[b]];
        uint64 selector = 0;
        for (uint p = 0; p < 16; p++) {
          uint error_best = cUINT32_MAX;
          uint8 s_best = 0;
          for (uint8 t = 0; t < 8; t++) {
            uint8 s = m_has_etc_color_blocks ? t : results.m_reordered ? 7 - g_dxt5_to_linear[t] : g_dxt5_to_linear[t];
            int delta = m_blocks[m_has_subblocks ? b >> 1 : b][p][component_index] - alpha_values[s];
            uint error = delta >= 0 ? delta : -delta;
            if (error < error_best) {
              s_best = s;
              error_best = error;
            }
          }
          selector = selector << 3 | s_best;
        }
        m_block_selectors[cAlpha0 + a][b] = selector << 16 | weight;
      }
    }

    dxt_endpoint_refiner::params refinerParams;
    dxt_endpoint_refiner::results refinerResults;
    refinerParams.m_perceptual = m_params.m_perceptual;
    refinerParams.m_pSelectors = selectors.get_ptr();
    refinerParams.m_pPixels = cluster.pixels.get_ptr();
    refinerParams.m_num_pixels = cluster.pixels.size();
    refinerParams.m_dxt1_selectors = false;
    refinerParams.m_error_to_beat = results.m_error;
    refinerParams.m_block_index = cluster_index;
    cluster.refined_alpha = !m_has_etc_color_blocks && refiner.refine(refinerParams, refinerResults);
    if (cluster.refined_alpha) {
      cluster.first_endpoint = refinerResults.m_low_color;
      cluster.second_endpoint = refinerResults.m_high_color;
      dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
      for (uint i = 0; i < 8; i++)
        cluster.refined_alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    } else {
      memcpy(cluster.refined_alpha_values, cluster.alpha_values, sizeof(cluster.refined_alpha_values));
    }
  }
}